

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O3

QDebug __thiscall
QtPrivate::printAssociativeContainer<QHash<QString,QVariant>>
          (QtPrivate *this,QDebug debug,char *which,QHash<QString,_QVariant> *c)

{
  char *pcVar1;
  Entry *pEVar2;
  QString *pQVar3;
  QHash<QString,_QVariant> *pQVar4;
  ulong uVar5;
  storage_type *psVar6;
  Data *pDVar7;
  QTextStream *pQVar8;
  QString *this_00;
  char16_t *begin;
  ulong uVar9;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QByteArrayView ba_00;
  QByteArrayView ba_01;
  QDebugStateSaver saver;
  QDebug local_60;
  QDebugStateSaver local_58;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  pQVar4 = c;
  QDebugStateSaver::QDebugStateSaver(&local_58,(QDebug *)debug.stream);
  pQVar8 = (QTextStream *)((debug.stream)->ts)._vptr_QTextStream;
  *(undefined1 *)&pQVar8[3]._vptr_QTextStream = 0;
  if (which == (char *)0x0) {
    this_00 = (QString *)0x0;
  }
  else {
    pQVar3 = (QString *)0xffffffffffffffff;
    do {
      this_00 = (QString *)((long)&(pQVar3->d).d + 1);
      pcVar1 = which + 1 + (long)pQVar3;
      pQVar3 = this_00;
    } while (*pcVar1 != '\0');
  }
  ba.m_data = (storage_type *)pQVar4;
  ba.m_size = (qsizetype)which;
  QString::fromUtf8(&local_50,this_00,ba);
  ::QTextStream::operator<<(pQVar8,&local_50);
  if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar8 = (QTextStream *)((debug.stream)->ts)._vptr_QTextStream;
  if (*(char *)&pQVar8[3]._vptr_QTextStream == '\x01') {
    ::QTextStream::operator<<(pQVar8,' ');
    pQVar8 = (QTextStream *)((debug.stream)->ts)._vptr_QTextStream;
  }
  ba_00.m_data = (storage_type *)pQVar4;
  ba_00.m_size = (qsizetype)"(";
  QString::fromUtf8(&local_50,(QString *)0x1,ba_00);
  ::QTextStream::operator<<(pQVar8,&local_50);
  if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar8 = (QTextStream *)((debug.stream)->ts)._vptr_QTextStream;
  if (*(char *)&pQVar8[3]._vptr_QTextStream == '\x01') {
    ::QTextStream::operator<<(pQVar8,' ');
  }
  pDVar7 = c->d;
  if (pDVar7 == (Data *)0x0) {
    pDVar7 = (Data *)0x0;
    uVar9 = 0;
    goto LAB_002aa2cd;
  }
  if (pDVar7->spans->offsets[0] == 0xff) {
    uVar5 = 1;
    do {
      uVar9 = uVar5;
      if (pDVar7->numBuckets == uVar9) goto LAB_002aa2cb;
      uVar5 = uVar9 + 1;
      if (pDVar7->spans[uVar9 >> 7].offsets[(uint)uVar9 & 0x7f] != 0xff) goto LAB_002aa2cd;
    } while( true );
  }
  uVar9 = 0;
LAB_002aa15c:
  ::QTextStream::operator<<((QTextStream *)((debug.stream)->ts)._vptr_QTextStream,'(');
  pQVar8 = (QTextStream *)((debug.stream)->ts)._vptr_QTextStream;
  if (*(char *)&pQVar8[3]._vptr_QTextStream == '\x01') {
    ::QTextStream::operator<<(pQVar8,' ');
  }
  pEVar2 = pDVar7->spans[uVar9 >> 7].entries;
  uVar5 = (ulong)pDVar7->spans[uVar9 >> 7].offsets[(uint)uVar9 & 0x7f];
  psVar6 = (storage_type *)(uVar5 * 0x38);
  begin = *(char16_t **)(pEVar2[uVar5].storage.data + 8);
  if ((QChar *)begin == (QChar *)0x0) {
    begin = &QString::_empty;
  }
  QDebug::putString((QDebug *)debug.stream,(QChar *)begin,
                    *(size_t *)(pEVar2[uVar5].storage.data + 0x10));
  pQVar8 = (QTextStream *)((debug.stream)->ts)._vptr_QTextStream;
  if (*(char *)&pQVar8[3]._vptr_QTextStream == '\x01') {
    ::QTextStream::operator<<(pQVar8,' ');
    pQVar8 = (QTextStream *)((debug.stream)->ts)._vptr_QTextStream;
  }
  ba_01.m_data = psVar6;
  ba_01.m_size = (qsizetype)", ";
  QString::fromUtf8(&local_50,(QString *)0x2,ba_01);
  ::QTextStream::operator<<(pQVar8,&local_50);
  if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar8 = (QTextStream *)((debug.stream)->ts)._vptr_QTextStream;
  if (*(char *)&pQVar8[3]._vptr_QTextStream == '\x01') {
    ::QTextStream::operator<<(pQVar8,' ');
  }
  ::operator<<(&local_60,(QVariant *)debug.stream);
  ::QTextStream::operator<<(&(local_60.stream)->ts,')');
  if ((local_60.stream)->space == true) {
    ::QTextStream::operator<<(&(local_60.stream)->ts,' ');
  }
  QDebug::~QDebug(&local_60);
  do {
    if (pDVar7->numBuckets - 1 == uVar9) goto LAB_002aa2cb;
    uVar9 = uVar9 + 1;
  } while (pDVar7->spans[uVar9 >> 7].offsets[(uint)uVar9 & 0x7f] == 0xff);
  goto LAB_002aa2cd;
LAB_002aa2cb:
  uVar9 = 0;
  pDVar7 = (Data *)0x0;
LAB_002aa2cd:
  if (uVar9 == 0 && pDVar7 == (Data *)0x0) {
    ::QTextStream::operator<<((QTextStream *)((debug.stream)->ts)._vptr_QTextStream,')');
    pQVar8 = (QTextStream *)((debug.stream)->ts)._vptr_QTextStream;
    if (*(char *)&pQVar8[3]._vptr_QTextStream == '\x01') {
      ::QTextStream::operator<<(pQVar8,' ');
      pQVar8 = (QTextStream *)((debug.stream)->ts)._vptr_QTextStream;
    }
    ((debug.stream)->ts)._vptr_QTextStream = (_func_int **)0x0;
    *(QTextStream **)this = pQVar8;
    QDebugStateSaver::~QDebugStateSaver(&local_58);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
      __stack_chk_fail();
    }
    return (QDebug)(Stream *)this;
  }
  goto LAB_002aa15c;
}

Assistant:

inline QDebug printAssociativeContainer(QDebug debug, const char *which, const AssociativeContainer &c)
{
    const QDebugStateSaver saver(debug);
    debug.nospace() << which << "(";
    for (typename AssociativeContainer::const_iterator it = c.constBegin();
         it != c.constEnd(); ++it) {
        debug << '(' << it.key() << ", " << it.value() << ')';
    }
    debug << ')';
    return debug;
}